

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::sse42::SubdivPatch1IntersectorK<4>,_true>::
     occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  GridSOA *pGVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  BVH *bvh;
  size_t sVar5;
  Ref<embree::Geometry> *pRVar6;
  Geometry *pGVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [12];
  undefined1 auVar20 [12];
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  GridSOA *pGVar27;
  bool bVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  int iVar32;
  undefined1 *puVar33;
  undefined1 *puVar34;
  long lVar35;
  RTCRayN *pRVar36;
  undefined8 uVar37;
  undefined4 uVar38;
  size_t sVar39;
  RTCIntersectArguments *pRVar40;
  int iVar41;
  RTCIntersectArguments *pRVar42;
  long lVar43;
  ulong uVar44;
  long lVar45;
  long lVar46;
  NodeRef root;
  size_t sVar47;
  ulong uVar48;
  long lVar49;
  size_t sVar50;
  undefined1 *puVar51;
  long lVar52;
  NodeRef *pNVar53;
  ulong uVar54;
  long lVar55;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar56;
  float fVar57;
  float fVar76;
  float fVar77;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar78;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  float fVar79;
  float fVar91;
  float fVar92;
  undefined1 auVar80 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar81;
  float fVar93;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar94;
  float fVar111;
  float fVar113;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar95;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar100;
  float fVar112;
  float fVar114;
  float fVar115;
  float fVar116;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  float fVar117;
  float fVar118;
  float fVar125;
  float fVar127;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  float fVar126;
  float fVar128;
  float fVar129;
  float fVar130;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar140;
  float fVar144;
  undefined1 auVar135 [16];
  float fVar141;
  float fVar145;
  float fVar146;
  float fVar147;
  undefined1 auVar136 [16];
  float fVar142;
  float fVar143;
  float fVar148;
  float fVar149;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  float fVar162;
  float fVar163;
  float fVar170;
  float fVar171;
  undefined1 auVar164 [16];
  float fVar172;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  float fVar173;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  float fVar180;
  float fVar184;
  float fVar185;
  float fVar186;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  uint uVar187;
  float fVar188;
  uint uVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  int iVar206;
  float fVar207;
  float fVar208;
  int iVar209;
  float fVar210;
  float fVar211;
  int iVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  float fVar217;
  float fVar218;
  float fVar219;
  float fVar220;
  float fVar221;
  uint uVar222;
  float fVar223;
  float fVar224;
  uint uVar225;
  float fVar226;
  uint uVar227;
  float fVar228;
  float fVar229;
  float fVar230;
  float fVar231;
  float fVar232;
  float fVar233;
  float fVar234;
  float fVar235;
  undefined1 local_1b98 [16];
  undefined8 local_1b88;
  undefined8 uStack_1b80;
  float local_1b58;
  float fStack_1b54;
  float fStack_1b50;
  float local_1b48;
  float fStack_1b44;
  float fStack_1b40;
  float fStack_1b3c;
  undefined8 local_1b18;
  undefined8 uStack_1b10;
  undefined1 local_1ac8 [16];
  GridSOA *local_1ab8;
  undefined4 local_1aac;
  undefined1 local_1aa8 [8];
  float fStack_1aa0;
  float fStack_1a9c;
  vbool<4> terminated;
  Precalculations pre;
  RTCFilterFunctionNArguments args;
  undefined8 uStack_1a00;
  undefined8 uStack_19f0;
  undefined8 local_1978;
  undefined8 uStack_1970;
  undefined8 local_1968;
  undefined8 uStack_1960;
  undefined1 local_1958 [16];
  float local_1948;
  float fStack_1944;
  float fStack_1940;
  float fStack_193c;
  undefined1 local_1938 [8];
  float fStack_1930;
  float fStack_192c;
  uint local_1928;
  uint uStack_1924;
  uint uStack_1920;
  uint uStack_191c;
  uint local_1918;
  uint uStack_1914;
  uint uStack_1910;
  uint uStack_190c;
  uint local_1908;
  uint uStack_1904;
  uint uStack_1900;
  uint uStack_18fc;
  uint local_18f8;
  uint uStack_18f4;
  uint uStack_18f0;
  uint uStack_18ec;
  TravRayK<4,_true> tray;
  undefined1 local_17f8 [16];
  undefined1 local_17e8 [16];
  undefined1 local_17d8 [16];
  float local_17c8;
  float fStack_17c4;
  float fStack_17c0;
  float fStack_17bc;
  undefined8 local_17b8;
  undefined8 uStack_17b0;
  undefined8 local_17a8;
  undefined8 uStack_17a0;
  undefined8 local_1798;
  undefined8 uStack_1790;
  undefined1 local_1788 [16];
  undefined1 local_1778 [16];
  undefined1 local_1768 [16];
  float local_1758;
  float fStack_1754;
  float fStack_1750;
  float fStack_174c;
  undefined8 local_1748;
  undefined8 uStack_1740;
  float local_1738;
  float fStack_1734;
  float fStack_1730;
  float fStack_172c;
  undefined8 local_1728;
  undefined8 uStack_1720;
  undefined8 uStack_1700;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  undefined1 auVar189 [16];
  
  uVar26 = mm_lookupmask_ps._8_8_;
  uVar25 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  stack_node[1].ptr = (bvh->root).ptr;
  if (stack_node[1].ptr != 8) {
    pRVar42 = (RTCIntersectArguments *)ray;
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       (pRVar42 = context->args,
       (pRVar42->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar176._8_4_ = 0xffffffff;
    auVar176._0_8_ = 0xffffffffffffffff;
    auVar176._12_4_ = 0xffffffff;
    auVar156 = *(undefined1 (*) [16])(ray + 0x80);
    auVar154._0_12_ = ZEXT812(0);
    auVar154._12_4_ = 0;
    uVar187 = -(uint)((valid_i->field_0).i[0] == -1 && 0.0 <= auVar156._0_4_);
    uVar192 = -(uint)((valid_i->field_0).i[1] == -1 && 0.0 <= auVar156._4_4_);
    auVar189._0_8_ = CONCAT44(uVar192,uVar187);
    auVar189._8_4_ = -(uint)((valid_i->field_0).i[2] == -1 && 0.0 <= auVar156._8_4_);
    auVar189._12_4_ = -(uint)((valid_i->field_0).i[3] == -1 && 0.0 <= auVar156._12_4_);
    iVar41 = movmskps((int)pRVar42,auVar189);
    if (iVar41 != 0) {
      pre.super_Precalculations.grid = (GridSOA *)0x0;
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 =
           (vfloat_impl<4>)
           *(undefined1 (*) [16])((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(ray + 0x40))->v;
      tray.dir.field_0.field_0.y.field_0 =
           (vfloat_impl<4>)
           *(undefined1 (*) [16])((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(ray + 0x50))->v;
      tray.dir.field_0.field_0.z.field_0 =
           (vfloat_impl<4>)
           *(undefined1 (*) [16])((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(ray + 0x60))->v;
      auVar174 = divps(_DAT_01f7ba10,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar96._4_4_ = -(uint)(ABS(tray.dir.field_0._4_4_) < 1e-18);
      auVar96._0_4_ = -(uint)(ABS(tray.dir.field_0._0_4_) < 1e-18);
      auVar96._8_4_ = -(uint)(ABS(tray.dir.field_0._8_4_) < 1e-18);
      auVar96._12_4_ = -(uint)(ABS(tray.dir.field_0._12_4_) < 1e-18);
      auVar119 = divps(_DAT_01f7ba10,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar58._4_4_ = -(uint)(ABS(tray.dir.field_0._20_4_) < 1e-18);
      auVar58._0_4_ = -(uint)(ABS(tray.dir.field_0._16_4_) < 1e-18);
      auVar80 = divps(_DAT_01f7ba10,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)blendvps(auVar174,_DAT_01fab950,auVar96)
      ;
      auVar58._8_4_ = -(uint)(ABS(tray.dir.field_0._24_4_) < 1e-18);
      auVar58._12_4_ = -(uint)(ABS(tray.dir.field_0._28_4_) < 1e-18);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)blendvps(auVar119,_DAT_01fab950,auVar58)
      ;
      auVar119._4_4_ = -(uint)(ABS(tray.dir.field_0._36_4_) < 1e-18);
      auVar119._0_4_ = -(uint)(ABS(tray.dir.field_0._32_4_) < 1e-18);
      auVar119._8_4_ = -(uint)(ABS(tray.dir.field_0._40_4_) < 1e-18);
      auVar119._12_4_ = -(uint)(ABS(tray.dir.field_0._44_4_) < 1e-18);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)blendvps(auVar80,_DAT_01fab950,auVar119)
      ;
      tray.nearXYZ.field_0._0_8_ =
           CONCAT44(-(uint)(tray.rdir.field_0._4_4_ < 0.0),-(uint)(tray.rdir.field_0._0_4_ < 0.0)) &
           0x1000000010;
      tray.nearXYZ.field_0._8_4_ = -(uint)(tray.rdir.field_0._8_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._12_4_ = -(uint)(tray.rdir.field_0._12_4_ < 0.0) & 0x10;
      auVar80._4_4_ = -(uint)(0.0 <= tray.rdir.field_0._20_4_);
      auVar80._0_4_ = -(uint)(0.0 <= tray.rdir.field_0._16_4_);
      auVar80._8_4_ = -(uint)(0.0 <= tray.rdir.field_0._24_4_);
      auVar80._12_4_ = -(uint)(0.0 <= tray.rdir.field_0._28_4_);
      tray.nearXYZ.field_0.field_0.y.field_0 =
           (vint_impl<4>)blendvps(_DAT_01faeed0,_DAT_01f8c1f0,auVar80);
      auVar174._4_4_ = -(uint)(0.0 <= tray.rdir.field_0._36_4_);
      auVar174._0_4_ = -(uint)(0.0 <= tray.rdir.field_0._32_4_);
      auVar174._8_4_ = -(uint)(0.0 <= tray.rdir.field_0._40_4_);
      auVar174._12_4_ = -(uint)(0.0 <= tray.rdir.field_0._44_4_);
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)blendvps(_DAT_01faeef0,_DAT_01faeee0,auVar174);
      auVar96 = maxps(*(undefined1 (*) [16])(ray + 0x30),auVar154);
      auVar154 = maxps(auVar156,auVar154);
      iVar41 = (int)DAT_01f7a9f0;
      iVar206 = DAT_01f7a9f0._4_4_;
      iVar209 = DAT_01f7a9f0._8_4_;
      iVar212 = DAT_01f7a9f0._12_4_;
      auVar156._8_4_ = auVar189._8_4_;
      auVar156._0_8_ = auVar189._0_8_;
      auVar156._12_4_ = auVar189._12_4_;
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           blendvps((undefined1  [16])_DAT_01f7a9f0,auVar96,auVar156);
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)blendvps(_DAT_01f7aa00,auVar154,auVar156);
      terminated.field_0 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar176 ^ auVar189);
      if (context->user == (RTCRayQueryContext *)0x0) {
        puVar51 = (undefined1 *)0x3;
        sVar39 = 0;
      }
      else {
        sVar39 = CONCAT71((int7)((ulong)context->args >> 8),
                          *(byte *)((long)&context->args->flags + 2)) & 0xffffffffffffff01;
        puVar51 = (undefined1 *)((ulong)((char)sVar39 == '\0') + 2);
      }
      pNVar53 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar56 = &stack_near[2].field_0;
      stack_near[0].field_0 = _DAT_01f7a9f0;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      puVar33 = mm_lookupmask_ps;
LAB_00dbd981:
      do {
        do {
          root.ptr = pNVar53[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_00dbf07d;
          pNVar53 = pNVar53 + -1;
          paVar56 = paVar56 + -1;
          aVar81.v = *(__m128 *)paVar56->v;
          auVar59._4_4_ = -(uint)(aVar81.v[1] < tray.tfar.field_0.v[1]);
          auVar59._0_4_ = -(uint)(aVar81.v[0] < tray.tfar.field_0.v[0]);
          auVar59._8_4_ = -(uint)(aVar81.v[2] < tray.tfar.field_0.v[2]);
          auVar59._12_4_ = -(uint)(aVar81._12_4_ < tray.tfar.field_0.v[3]);
          uVar29 = movmskps((int)puVar33,auVar59);
          puVar33 = (undefined1 *)(ulong)uVar29;
        } while (uVar29 == 0);
        uVar54 = (ulong)(byte)uVar29;
        puVar34 = (undefined1 *)(ulong)(uint)POPCOUNT(uVar29 & 0xff);
        puVar33 = puVar34;
        if (puVar51 < puVar34) {
LAB_00dbd9c0:
          do {
            pGVar27 = pre.super_Precalculations.grid;
            uVar38 = (undefined4)sVar39;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_00dbf07d;
              auVar64._4_4_ = -(uint)(aVar81.v[1] < tray.tfar.field_0.v[1]);
              auVar64._0_4_ = -(uint)(aVar81.v[0] < tray.tfar.field_0.v[0]);
              auVar64._8_4_ = -(uint)(aVar81.v[2] < tray.tfar.field_0.v[2]);
              auVar64._12_4_ = -(uint)(aVar81.v[3] < tray.tfar.field_0.v[3]);
              uVar29 = movmskps((int)puVar33,auVar64);
              puVar33 = (undefined1 *)(ulong)uVar29;
              if (uVar29 != 0) {
                if (((uint)root.ptr & 0xf) == 8) {
                  local_1b98._0_8_ = terminated.field_0._0_8_ ^ 0xffffffffffffffff;
                  local_1b98._8_4_ = terminated.field_0.i[2] ^ 0xffffffff;
                  local_1b98._12_4_ = terminated.field_0.i[3] ^ 0xffffffff;
                  uVar54 = (ulong)*(uint *)(pre.super_Precalculations.grid + 0x14);
                  uVar29 = *(uint *)(pre.super_Precalculations.grid + 0xc);
                  iVar2 = *(int *)(pre.super_Precalculations.grid + 0x10);
                  uVar44 = (ulong)*(uint *)(pre.super_Precalculations.grid + 0x24);
                  lVar43 = uVar44 + uVar54 * 0xc;
                  uVar48 = root.ptr >> 4;
                  lVar52 = (ulong)uVar29 * 4;
                  lVar22 = uVar48 * 4 + uVar44 + uVar54 * 8 + 0x30;
                  pRVar42 = (RTCIntersectArguments *)
                            (pre.super_Precalculations.grid +
                            uVar48 * 4 + uVar44 + uVar54 * 4 + 0x30);
                  lVar35 = uVar44 + uVar48 * 4 + 0x30;
                  uVar37 = CONCAT71((int7)((ulong)lVar35 >> 8),1);
                  lVar49 = 0;
                  do {
                    local_1aac = (undefined4)uVar37;
                    lVar45 = (lVar49 + 1) * lVar52;
                    lVar21 = lVar45 + uVar48 * 4 + lVar43 + 0x2c;
                    pGVar1 = pGVar27 + lVar45 + lVar22;
                    lVar46 = lVar45 + uVar44 + 0x2c + uVar48 * 4;
                    lVar49 = lVar49 * lVar52;
                    lVar24 = lVar49 + uVar48 * 4 + lVar43 + 0x30;
                    lVar23 = lVar49 + lVar22;
                    local_1ab8 = pGVar27 + lVar49 + lVar35;
                    lVar55 = 0;
                    pRVar40 = pRVar42;
                    do {
                      uVar38 = SUB84(pRVar40,0);
                      if ((ulong)((ulong)uVar29 != 2) * 4 + 4 == lVar55) break;
                      fVar234 = *(float *)(local_1ab8 + lVar55 + -4);
                      fVar217 = *(float *)(local_1ab8 + lVar55);
                      fStack_1a9c = *(float *)((long)pRVar42 + lVar55 + lVar49 + -4);
                      fVar148 = *(float *)((long)&pRVar42->flags + lVar55 + lVar49);
                      fVar226 = *(float *)(pGVar27 + lVar55 + lVar23 + -4);
                      fVar149 = *(float *)(pGVar27 + lVar55 + lVar23);
                      fVar219 = *(float *)(pGVar27 + lVar55 + lVar46);
                      fVar221 = *(float *)((long)pRVar42 + lVar55 + lVar45 + -4);
                      fVar224 = *(float *)(pGVar1 + lVar55 + -4);
                      fVar132 = *(float *)ray;
                      fVar141 = *(float *)(ray + 4);
                      fVar145 = *(float *)(ray + 8);
                      fVar147 = *(float *)(ray + 0xc);
                      fVar57 = *(float *)(ray + 0x10);
                      fVar76 = *(float *)(ray + 0x14);
                      fVar77 = *(float *)(ray + 0x18);
                      fVar78 = *(float *)(ray + 0x1c);
                      fVar79 = *(float *)(ray + 0x20);
                      fVar91 = *(float *)(ray + 0x24);
                      fVar92 = *(float *)(ray + 0x28);
                      fVar93 = *(float *)(ray + 0x2c);
                      fVar228 = fVar234 - fVar132;
                      fVar230 = fVar234 - fVar141;
                      fVar232 = fVar234 - fVar145;
                      fVar234 = fVar234 - fVar147;
                      local_1aa8._0_4_ = fStack_1a9c - fVar57;
                      local_1aa8._4_4_ = fStack_1a9c - fVar76;
                      fStack_1aa0 = fStack_1a9c - fVar77;
                      fStack_1a9c = fStack_1a9c - fVar78;
                      fVar218 = fVar226 - fVar79;
                      fVar220 = fVar226 - fVar91;
                      fVar223 = fVar226 - fVar92;
                      fVar226 = fVar226 - fVar93;
                      fVar196 = fVar217 - fVar132;
                      fVar198 = fVar217 - fVar141;
                      fVar200 = fVar217 - fVar145;
                      fVar202 = fVar217 - fVar147;
                      fVar131 = fVar148 - fVar57;
                      fVar140 = fVar148 - fVar76;
                      fVar144 = fVar148 - fVar77;
                      fVar146 = fVar148 - fVar78;
                      fVar163 = fVar149 - fVar79;
                      fVar170 = fVar149 - fVar91;
                      fVar171 = fVar149 - fVar92;
                      fVar172 = fVar149 - fVar93;
                      fVar132 = fVar219 - fVar132;
                      fVar141 = fVar219 - fVar141;
                      fVar145 = fVar219 - fVar145;
                      fVar147 = fVar219 - fVar147;
                      fVar57 = fVar221 - fVar57;
                      fVar76 = fVar221 - fVar76;
                      fVar77 = fVar221 - fVar77;
                      fVar78 = fVar221 - fVar78;
                      fVar79 = fVar224 - fVar79;
                      fVar91 = fVar224 - fVar91;
                      fVar92 = fVar224 - fVar92;
                      fVar93 = fVar224 - fVar93;
                      fVar117 = fVar132 - fVar228;
                      fVar125 = fVar141 - fVar230;
                      fVar127 = fVar145 - fVar232;
                      fVar129 = fVar147 - fVar234;
                      fVar94 = fVar57 - (float)local_1aa8._0_4_;
                      fVar111 = fVar76 - (float)local_1aa8._4_4_;
                      fVar113 = fVar77 - fStack_1aa0;
                      fVar115 = fVar78 - fStack_1a9c;
                      fVar204 = fVar79 - fVar218;
                      fVar207 = fVar91 - fVar220;
                      fVar210 = fVar92 - fVar223;
                      fVar213 = fVar93 - fVar226;
                      auVar19 = *(undefined1 (*) [12])(ray + 0x60);
                      fVar162 = *(float *)(ray + 0x6c);
                      auVar20 = *(undefined1 (*) [12])(ray + 0x50);
                      fVar173 = *(float *)(ray + 0x5c);
                      fVar133 = *(float *)(ray + 0x40);
                      fVar134 = *(float *)(ray + 0x44);
                      fVar142 = *(float *)(ray + 0x48);
                      fVar143 = *(float *)(ray + 0x4c);
                      fVar215 = (fVar94 * (fVar79 + fVar218) -
                                (fVar57 + (float)local_1aa8._0_4_) * fVar204) * fVar133 +
                                ((fVar132 + fVar228) * fVar204 - (fVar79 + fVar218) * fVar117) *
                                *(float *)(ray + 0x50) +
                                (fVar117 * (fVar57 + (float)local_1aa8._0_4_) -
                                (fVar132 + fVar228) * fVar94) * *(float *)(ray + 0x60);
                      fVar216 = (fVar111 * (fVar91 + fVar220) -
                                (fVar76 + (float)local_1aa8._4_4_) * fVar207) * fVar134 +
                                ((fVar141 + fVar230) * fVar207 - (fVar91 + fVar220) * fVar125) *
                                *(float *)(ray + 0x54) +
                                (fVar125 * (fVar76 + (float)local_1aa8._4_4_) -
                                (fVar141 + fVar230) * fVar111) * *(float *)(ray + 100);
                      uStack_1b10._0_4_ =
                           (fVar113 * (fVar92 + fVar223) - (fVar77 + fStack_1aa0) * fVar210) *
                           fVar142 + ((fVar145 + fVar232) * fVar210 - (fVar92 + fVar223) * fVar127)
                                     * *(float *)(ray + 0x58) +
                                     (fVar127 * (fVar77 + fStack_1aa0) -
                                     (fVar145 + fVar232) * fVar113) * *(float *)(ray + 0x68);
                      uStack_1b10._4_4_ =
                           (fVar115 * (fVar93 + fVar226) - (fVar78 + fStack_1a9c) * fVar213) *
                           fVar143 + ((fVar147 + fVar234) * fVar213 - (fVar93 + fVar226) * fVar129)
                                     * fVar173 +
                                     (fVar129 * (fVar78 + fStack_1a9c) -
                                     (fVar147 + fVar234) * fVar115) * fVar162;
                      fVar118 = fVar228 - fVar196;
                      fVar126 = fVar230 - fVar198;
                      fVar128 = fVar232 - fVar200;
                      fVar130 = fVar234 - fVar202;
                      fVar180 = (float)local_1aa8._0_4_ - fVar131;
                      fVar184 = (float)local_1aa8._4_4_ - fVar140;
                      fVar185 = fStack_1aa0 - fVar144;
                      fVar186 = fStack_1a9c - fVar146;
                      fVar95 = fVar218 - fVar163;
                      fVar112 = fVar220 - fVar170;
                      fVar114 = fVar223 - fVar171;
                      fVar116 = fVar226 - fVar172;
                      local_1b58 = auVar19._0_4_;
                      fStack_1b54 = auVar19._4_4_;
                      fStack_1b50 = auVar19._8_4_;
                      local_1b48 = auVar20._0_4_;
                      fStack_1b44 = auVar20._4_4_;
                      fStack_1b40 = auVar20._8_4_;
                      fVar205 = (fVar180 * (fVar218 + fVar163) -
                                ((float)local_1aa8._0_4_ + fVar131) * fVar95) * fVar133 +
                                ((fVar228 + fVar196) * fVar95 - (fVar218 + fVar163) * fVar118) *
                                local_1b48 +
                                (fVar118 * ((float)local_1aa8._0_4_ + fVar131) -
                                (fVar228 + fVar196) * fVar180) * local_1b58;
                      fVar208 = (fVar184 * (fVar220 + fVar170) -
                                ((float)local_1aa8._4_4_ + fVar140) * fVar112) * fVar134 +
                                ((fVar230 + fVar198) * fVar112 - (fVar220 + fVar170) * fVar126) *
                                fStack_1b44 +
                                (fVar126 * ((float)local_1aa8._4_4_ + fVar140) -
                                (fVar230 + fVar198) * fVar184) * fStack_1b54;
                      fVar211 = (fVar185 * (fVar223 + fVar171) - (fStack_1aa0 + fVar144) * fVar114)
                                * fVar142 +
                                ((fVar232 + fVar200) * fVar114 - (fVar223 + fVar171) * fVar128) *
                                fStack_1b40 +
                                (fVar128 * (fStack_1aa0 + fVar144) - (fVar232 + fVar200) * fVar185)
                                * fStack_1b50;
                      fVar214 = (fVar186 * (fVar226 + fVar172) - (fStack_1a9c + fVar146) * fVar116)
                                * fVar143 +
                                ((fVar234 + fVar202) * fVar116 - (fVar226 + fVar172) * fVar130) *
                                fVar173 + (fVar130 * (fStack_1a9c + fVar146) -
                                          (fVar234 + fVar202) * fVar186) * fVar162;
                      fVar188 = fVar196 - fVar132;
                      fVar193 = fVar198 - fVar141;
                      fVar194 = fVar200 - fVar145;
                      fVar195 = fVar202 - fVar147;
                      fVar197 = fVar131 - fVar57;
                      fVar199 = fVar140 - fVar76;
                      fVar201 = fVar144 - fVar77;
                      fVar203 = fVar146 - fVar78;
                      fVar229 = fVar163 - fVar79;
                      fVar231 = fVar170 - fVar91;
                      fVar233 = fVar171 - fVar92;
                      fVar235 = fVar172 - fVar93;
                      fVar57 = (fVar197 * (fVar79 + fVar163) - (fVar57 + fVar131) * fVar229) *
                               fVar133 + ((fVar132 + fVar196) * fVar229 -
                                         (fVar79 + fVar163) * fVar188) * local_1b48 +
                                         (fVar188 * (fVar57 + fVar131) -
                                         (fVar132 + fVar196) * fVar197) * local_1b58;
                      fVar76 = (fVar199 * (fVar91 + fVar170) - (fVar76 + fVar140) * fVar231) *
                               fVar134 + ((fVar141 + fVar198) * fVar231 -
                                         (fVar91 + fVar170) * fVar193) * fStack_1b44 +
                                         (fVar193 * (fVar76 + fVar140) -
                                         (fVar141 + fVar198) * fVar199) * fStack_1b54;
                      fVar145 = (fVar201 * (fVar92 + fVar171) - (fVar77 + fVar144) * fVar233) *
                                fVar142 + ((fVar145 + fVar200) * fVar233 -
                                          (fVar92 + fVar171) * fVar194) * fStack_1b40 +
                                          (fVar194 * (fVar77 + fVar144) -
                                          (fVar145 + fVar200) * fVar201) * fStack_1b50;
                      fVar147 = (fVar203 * (fVar93 + fVar172) - (fVar78 + fVar146) * fVar235) *
                                fVar143 + ((fVar147 + fVar202) * fVar235 -
                                          (fVar93 + fVar172) * fVar195) * fVar173 +
                                          (fVar195 * (fVar78 + fVar146) -
                                          (fVar147 + fVar202) * fVar203) * fVar162;
                      fVar132 = fVar215 + fVar205 + fVar57;
                      fVar141 = fVar216 + fVar208 + fVar76;
                      auVar101._0_8_ = CONCAT44(fVar141,fVar132);
                      auVar101._8_4_ = (float)uStack_1b10 + fVar211 + fVar145;
                      auVar101._12_4_ = uStack_1b10._4_4_ + fVar214 + fVar147;
                      auVar65._4_4_ = fVar216;
                      auVar65._0_4_ = fVar215;
                      auVar65._8_4_ = (float)uStack_1b10;
                      auVar65._12_4_ = uStack_1b10._4_4_;
                      auVar9._4_4_ = fVar208;
                      auVar9._0_4_ = fVar205;
                      auVar9._8_4_ = fVar211;
                      auVar9._12_4_ = fVar214;
                      auVar156 = minps(auVar65,auVar9);
                      auVar13._4_4_ = fVar76;
                      auVar13._0_4_ = fVar57;
                      auVar13._8_4_ = fVar145;
                      auVar13._12_4_ = fVar147;
                      auVar156 = minps(auVar156,auVar13);
                      local_1b18 = CONCAT44(fVar216,fVar215);
                      auVar165._4_4_ = fVar216;
                      auVar165._0_4_ = fVar215;
                      auVar165._8_4_ = (float)uStack_1b10;
                      auVar165._12_4_ = uStack_1b10._4_4_;
                      auVar10._4_4_ = fVar208;
                      auVar10._0_4_ = fVar205;
                      auVar10._8_4_ = fVar211;
                      auVar10._12_4_ = fVar214;
                      auVar176 = maxps(auVar165,auVar10);
                      auVar14._4_4_ = fVar76;
                      auVar14._0_4_ = fVar57;
                      auVar14._8_4_ = fVar145;
                      auVar14._12_4_ = fVar147;
                      auVar176 = maxps(auVar176,auVar14);
                      fVar132 = ABS(fVar132) * 1.1920929e-07;
                      fVar141 = ABS(fVar141) * 1.1920929e-07;
                      auVar166._0_8_ =
                           CONCAT44(-(uint)(auVar176._4_4_ <= fVar141 || -fVar141 <= auVar156._4_4_)
                                    & local_1b98._4_4_,
                                    -(uint)(auVar176._0_4_ <= fVar132 || -fVar132 <= auVar156._0_4_)
                                    & local_1b98._0_4_);
                      auVar166._8_4_ =
                           -(uint)(auVar176._8_4_ <= ABS(auVar101._8_4_) * 1.1920929e-07 ||
                                  -(ABS(auVar101._8_4_) * 1.1920929e-07) <= auVar156._8_4_) &
                           local_1b98._8_4_;
                      auVar166._12_4_ =
                           -(uint)(auVar176._12_4_ <= ABS(auVar101._12_4_) * 1.1920929e-07 ||
                                  -(ABS(auVar101._12_4_) * 1.1920929e-07) <= auVar156._12_4_) &
                           local_1b98._12_4_;
                      iVar41 = movmskps((int)pGVar1,auVar166);
                      if (iVar41 == 0) {
                        auVar160._8_4_ = auVar166._8_4_;
                        auVar160._0_8_ = auVar166._0_8_;
                        auVar160._12_4_ = auVar166._12_4_;
                      }
                      else {
                        auVar136._0_4_ = fVar94 * fVar95 - fVar180 * fVar204;
                        auVar136._4_4_ = fVar111 * fVar112 - fVar184 * fVar207;
                        auVar136._8_4_ = fVar113 * fVar114 - fVar185 * fVar210;
                        auVar136._12_4_ = fVar115 * fVar116 - fVar186 * fVar213;
                        auVar181._0_4_ = fVar180 * fVar229 - fVar197 * fVar95;
                        auVar181._4_4_ = fVar184 * fVar231 - fVar199 * fVar112;
                        auVar181._8_4_ = fVar185 * fVar233 - fVar201 * fVar114;
                        auVar181._12_4_ = fVar186 * fVar235 - fVar203 * fVar116;
                        auVar66._4_4_ = -(uint)(ABS(fVar184 * fVar207) < ABS(fVar199 * fVar112));
                        auVar66._0_4_ = -(uint)(ABS(fVar180 * fVar204) < ABS(fVar197 * fVar95));
                        auVar66._8_4_ = -(uint)(ABS(fVar185 * fVar210) < ABS(fVar201 * fVar114));
                        auVar66._12_4_ = -(uint)(ABS(fVar186 * fVar213) < ABS(fVar203 * fVar116));
                        auVar154 = blendvps(auVar181,auVar136,auVar66);
                        auVar178._0_4_ = fVar204 * fVar118 - fVar117 * fVar95;
                        auVar178._4_4_ = fVar207 * fVar126 - fVar125 * fVar112;
                        auVar178._8_4_ = fVar210 * fVar128 - fVar127 * fVar114;
                        auVar178._12_4_ = fVar213 * fVar130 - fVar129 * fVar116;
                        auVar190._0_4_ = fVar188 * fVar95 - fVar118 * fVar229;
                        auVar190._4_4_ = fVar193 * fVar112 - fVar126 * fVar231;
                        auVar190._8_4_ = fVar194 * fVar114 - fVar128 * fVar233;
                        auVar190._12_4_ = fVar195 * fVar116 - fVar130 * fVar235;
                        auVar67._4_4_ = -(uint)(ABS(fVar125 * fVar112) < ABS(fVar126 * fVar231));
                        auVar67._0_4_ = -(uint)(ABS(fVar117 * fVar95) < ABS(fVar118 * fVar229));
                        auVar67._8_4_ = -(uint)(ABS(fVar127 * fVar114) < ABS(fVar128 * fVar233));
                        auVar67._12_4_ = -(uint)(ABS(fVar129 * fVar116) < ABS(fVar130 * fVar235));
                        auVar96 = blendvps(auVar190,auVar178,auVar67);
                        auVar121._0_4_ = fVar118 * fVar197 - fVar188 * fVar180;
                        auVar121._4_4_ = fVar126 * fVar199 - fVar193 * fVar184;
                        auVar121._8_4_ = fVar128 * fVar201 - fVar194 * fVar185;
                        auVar121._12_4_ = fVar130 * fVar203 - fVar195 * fVar186;
                        auVar68._4_4_ = -(uint)(ABS(fVar126 * fVar111) < ABS(fVar193 * fVar184));
                        auVar68._0_4_ = -(uint)(ABS(fVar118 * fVar94) < ABS(fVar188 * fVar180));
                        auVar68._8_4_ = -(uint)(ABS(fVar128 * fVar113) < ABS(fVar194 * fVar185));
                        auVar68._12_4_ = -(uint)(ABS(fVar130 * fVar115) < ABS(fVar195 * fVar186));
                        auVar11._4_4_ = fVar125 * fVar184 - fVar126 * fVar111;
                        auVar11._0_4_ = fVar117 * fVar180 - fVar118 * fVar94;
                        auVar11._8_4_ = fVar127 * fVar185 - fVar128 * fVar113;
                        auVar11._12_4_ = fVar129 * fVar186 - fVar130 * fVar115;
                        auVar176 = blendvps(auVar121,auVar11,auVar68);
                        fVar132 = fVar133 * auVar154._0_4_ +
                                  local_1b48 * auVar96._0_4_ + local_1b58 * auVar176._0_4_;
                        fVar141 = fVar134 * auVar154._4_4_ +
                                  fStack_1b44 * auVar96._4_4_ + fStack_1b54 * auVar176._4_4_;
                        fVar145 = fVar142 * auVar154._8_4_ +
                                  fStack_1b40 * auVar96._8_4_ + fStack_1b50 * auVar176._8_4_;
                        fVar147 = fVar143 * auVar154._12_4_ +
                                  fVar173 * auVar96._12_4_ + fVar162 * auVar176._12_4_;
                        auVar158._0_4_ = fVar132 + fVar132;
                        auVar158._4_4_ = fVar141 + fVar141;
                        auVar158._8_4_ = fVar145 + fVar145;
                        auVar158._12_4_ = fVar147 + fVar147;
                        auVar82._0_4_ = fVar218 * auVar176._0_4_;
                        auVar82._4_4_ = fVar220 * auVar176._4_4_;
                        auVar82._8_4_ = fVar223 * auVar176._8_4_;
                        auVar82._12_4_ = fVar226 * auVar176._12_4_;
                        fVar145 = fVar228 * auVar154._0_4_ +
                                  (float)local_1aa8._0_4_ * auVar96._0_4_ + auVar82._0_4_;
                        fVar147 = fVar230 * auVar154._4_4_ +
                                  (float)local_1aa8._4_4_ * auVar96._4_4_ + auVar82._4_4_;
                        fVar57 = fVar232 * auVar154._8_4_ +
                                 fStack_1aa0 * auVar96._8_4_ + auVar82._8_4_;
                        fVar76 = fVar234 * auVar154._12_4_ +
                                 fStack_1a9c * auVar96._12_4_ + auVar82._12_4_;
                        auVar156 = rcpps(auVar82,auVar158);
                        fVar234 = auVar156._0_4_;
                        fVar226 = auVar156._4_4_;
                        fVar132 = auVar156._8_4_;
                        fVar141 = auVar156._12_4_;
                        fVar234 = ((1.0 - auVar158._0_4_ * fVar234) * fVar234 + fVar234) *
                                  (fVar145 + fVar145);
                        fVar226 = ((1.0 - auVar158._4_4_ * fVar226) * fVar226 + fVar226) *
                                  (fVar147 + fVar147);
                        fVar132 = ((1.0 - auVar158._8_4_ * fVar132) * fVar132 + fVar132) *
                                  (fVar57 + fVar57);
                        fVar141 = ((1.0 - auVar158._12_4_ * fVar141) * fVar141 + fVar141) *
                                  (fVar76 + fVar76);
                        auVar159._0_4_ =
                             (int)((uint)(auVar158._0_4_ != 0.0 &&
                                         (fVar234 <= *(float *)(ray + 0x80) &&
                                         *(float *)(ray + 0x30) <= fVar234)) * -0x80000000) >> 0x1f;
                        auVar159._4_4_ =
                             (int)((uint)(auVar158._4_4_ != 0.0 &&
                                         (fVar226 <= *(float *)(ray + 0x84) &&
                                         *(float *)(ray + 0x34) <= fVar226)) * -0x80000000) >> 0x1f;
                        auVar159._8_4_ =
                             (int)((uint)(auVar158._8_4_ != 0.0 &&
                                         (fVar132 <= *(float *)(ray + 0x88) &&
                                         *(float *)(ray + 0x38) <= fVar132)) * -0x80000000) >> 0x1f;
                        auVar159._12_4_ =
                             (int)((uint)(auVar158._12_4_ != 0.0 &&
                                         (fVar141 <= *(float *)(ray + 0x8c) &&
                                         *(float *)(ray + 0x3c) <= fVar141)) * -0x80000000) >> 0x1f;
                        auVar160 = auVar159 & auVar166;
                        iVar41 = movmskps(iVar41,auVar160);
                        if (iVar41 != 0) {
                          local_1728 = local_1b18;
                          uStack_1720 = uStack_1b10;
                          uStack_1700 = auVar101._8_8_;
                          uStack_1740 = uStack_1700;
                          local_1788 = auVar176;
                          local_1778 = auVar96;
                          local_1768 = auVar154;
                          local_1758 = fVar234;
                          fStack_1754 = fVar226;
                          fStack_1750 = fVar132;
                          fStack_174c = fVar141;
                          local_1748 = auVar101._0_8_;
                          local_1738 = fVar205;
                          fStack_1734 = fVar208;
                          fStack_1730 = fVar211;
                          fStack_172c = fVar214;
                        }
                      }
                      auVar153._4_4_ = fVar219;
                      auVar153._0_4_ = fVar219;
                      auVar153._8_4_ = fVar219;
                      auVar153._12_4_ = fVar219;
                      auVar191._4_4_ = fVar221;
                      auVar191._0_4_ = fVar221;
                      auVar191._8_4_ = fVar221;
                      auVar191._12_4_ = fVar221;
                      auVar183._4_4_ = fVar224;
                      auVar183._0_4_ = fVar224;
                      auVar183._8_4_ = fVar224;
                      auVar183._12_4_ = fVar224;
                      fVar234 = *(float *)(pGVar27 + lVar55 + lVar46 + 4);
                      fVar226 = *(float *)((long)&pRVar42->flags + lVar55 + lVar45);
                      fVar132 = *(float *)(pGVar1 + lVar55);
                      uVar30 = *(uint *)(pre.super_Precalculations.grid + 0x18);
                      pRVar6 = (context->scene->geometries).items;
                      pGVar7 = pRVar6[uVar30].ptr;
                      uVar222 = pGVar7->mask;
                      auVar83._0_4_ = -(uint)((uVar222 & *(uint *)(ray + 0x90)) == 0);
                      auVar83._4_4_ = -(uint)((uVar222 & *(uint *)(ray + 0x94)) == 0);
                      auVar83._8_4_ = -(uint)((uVar222 & *(uint *)(ray + 0x98)) == 0);
                      auVar83._12_4_ = -(uint)((uVar222 & *(uint *)(ray + 0x9c)) == 0);
                      auVar84 = ~auVar83 & auVar160;
                      iVar41 = movmskps((int)pRVar6,auVar84);
                      pRVar40 = (RTCIntersectArguments *)pre.super_Precalculations.grid;
                      if (iVar41 != 0) {
                        uVar225 = *(uint *)(pre.super_Precalculations.grid + 0x1c);
                        pRVar40 = (RTCIntersectArguments *)(ulong)uVar225;
                        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                           (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                          auVar18._8_8_ = uStack_1740;
                          auVar18._0_8_ = local_1748;
                          fVar76 = (float)((ulong)local_1748 >> 0x20);
                          fVar77 = (float)((ulong)uStack_1740 >> 0x20);
                          auVar156 = rcpps(ZEXT416(uVar222),auVar18);
                          fVar141 = auVar156._0_4_;
                          fVar145 = auVar156._4_4_;
                          fVar147 = auVar156._8_4_;
                          fVar57 = auVar156._12_4_;
                          fVar141 = (float)(-(uint)(1e-18 <= ABS((float)local_1748)) &
                                           (uint)(((float)DAT_01f7ba10 - (float)local_1748 * fVar141
                                                  ) * fVar141 + fVar141));
                          fVar145 = (float)(-(uint)(1e-18 <= ABS(fVar76)) &
                                           (uint)((DAT_01f7ba10._4_4_ - fVar76 * fVar145) * fVar145
                                                 + fVar145));
                          fVar147 = (float)(-(uint)(1e-18 <= ABS((float)uStack_1740)) &
                                           (uint)((DAT_01f7ba10._8_4_ - (float)uStack_1740 * fVar147
                                                  ) * fVar147 + fVar147));
                          fVar57 = (float)(-(uint)(1e-18 <= ABS(fVar77)) &
                                          (uint)((DAT_01f7ba10._12_4_ - fVar77 * fVar57) * fVar57 +
                                                fVar57));
                          auVar73._0_4_ = (float)local_1728 * fVar141;
                          auVar73._4_4_ = local_1728._4_4_ * fVar145;
                          auVar73._8_4_ = (float)uStack_1720 * fVar147;
                          auVar73._12_4_ = uStack_1720._4_4_ * fVar57;
                          auVar156 = minps(auVar73,_DAT_01f7ba10);
                          auVar103._0_4_ = fVar141 * local_1738;
                          auVar103._4_4_ = fVar145 * fStack_1734;
                          auVar103._8_4_ = fVar147 * fStack_1730;
                          auVar103._12_4_ = fVar57 * fStack_172c;
                          auVar176 = minps(auVar103,_DAT_01f7ba10);
                          uVar222 = *(uint *)(pGVar27 + lVar55 + lVar24 + -4);
                          auVar123._4_4_ = uVar222;
                          auVar123._0_4_ = uVar222;
                          auVar123._8_4_ = uVar222;
                          auVar123._12_4_ = uVar222;
                          auVar154 = pblendw(auVar123,ZEXT816(0),0xaa);
                          fVar173 = (float)DAT_01fab990;
                          fVar133 = DAT_01fab990._4_4_;
                          fVar134 = DAT_01fab990._8_4_;
                          fVar142 = DAT_01fab990._12_4_;
                          uVar227 = *(uint *)(pGVar27 + lVar55 + lVar21);
                          auVar152._4_4_ = uVar227;
                          auVar152._0_4_ = uVar227;
                          auVar152._8_4_ = uVar227;
                          auVar152._12_4_ = uVar227;
                          fVar141 = auVar156._0_4_;
                          fVar145 = auVar156._4_4_;
                          fVar147 = auVar156._8_4_;
                          fVar57 = auVar156._12_4_;
                          fVar76 = auVar176._0_4_;
                          fVar91 = ((float)DAT_01f7ba10 - fVar141) - fVar76;
                          fVar77 = auVar176._4_4_;
                          fVar92 = (DAT_01f7ba10._4_4_ - fVar145) - fVar77;
                          fVar78 = auVar176._8_4_;
                          fVar93 = (DAT_01f7ba10._8_4_ - fVar147) - fVar78;
                          fVar79 = auVar176._12_4_;
                          fVar162 = (DAT_01f7ba10._12_4_ - fVar57) - fVar79;
                          auVar176 = pblendw(auVar152,ZEXT816(0),0xaa);
                          uVar31 = *(uint *)(pGVar27 + lVar55 + lVar24);
                          auVar104._4_4_ = uVar31;
                          auVar104._0_4_ = uVar31;
                          auVar104._8_4_ = uVar31;
                          auVar104._12_4_ = uVar31;
                          auVar156 = pblendw(auVar104,ZEXT816(0),0xaa);
                          local_1948 = (float)auVar156._0_4_ * fVar173 * fVar141 +
                                       (float)auVar176._0_4_ * fVar173 * fVar76 +
                                       (float)auVar154._0_4_ * fVar173 * fVar91;
                          fStack_1944 = (float)auVar156._4_4_ * fVar133 * fVar145 +
                                        (float)auVar176._4_4_ * fVar133 * fVar77 +
                                        (float)auVar154._4_4_ * fVar133 * fVar92;
                          fStack_1940 = (float)auVar156._8_4_ * fVar134 * fVar147 +
                                        (float)auVar176._8_4_ * fVar134 * fVar78 +
                                        (float)auVar154._8_4_ * fVar134 * fVar93;
                          fStack_193c = (float)auVar156._12_4_ * fVar142 * fVar57 +
                                        (float)auVar176._12_4_ * fVar142 * fVar79 +
                                        (float)auVar154._12_4_ * fVar142 * fVar162;
                          local_1978 = local_1768._0_8_;
                          uStack_1970 = local_1768._8_8_;
                          local_1968 = local_1778._0_8_;
                          uStack_1960 = local_1778._8_8_;
                          local_1958 = local_1788;
                          local_1938._4_4_ =
                               (float)(uVar31 >> 0x10) * fVar133 * fVar145 +
                               (float)(uVar227 >> 0x10) * fVar133 * fVar77 +
                               fVar92 * (float)(uVar222 >> 0x10) * fVar133;
                          local_1938._0_4_ =
                               (float)(uVar31 >> 0x10) * fVar173 * fVar141 +
                               (float)(uVar227 >> 0x10) * fVar173 * fVar76 +
                               fVar91 * (float)(uVar222 >> 0x10) * fVar173;
                          fStack_1930 = (float)(uVar31 >> 0x10) * fVar134 * fVar147 +
                                        (float)(uVar227 >> 0x10) * fVar134 * fVar78 +
                                        fVar93 * (float)(uVar222 >> 0x10) * fVar134;
                          fStack_192c = (float)(uVar31 >> 0x10) * fVar142 * fVar57 +
                                        (float)(uVar227 >> 0x10) * fVar142 * fVar79 +
                                        fVar162 * (float)(uVar222 >> 0x10) * fVar142;
                          local_1908 = context->user->instID[0];
                          local_18f8 = context->user->instPrimID[0];
                          _local_1aa8 = *(undefined1 (*) [16])(ray + 0x80);
                          auVar17._4_4_ = fStack_1754;
                          auVar17._0_4_ = local_1758;
                          auVar17._8_4_ = fStack_1750;
                          auVar17._12_4_ = fStack_174c;
                          auVar156 = blendvps(_local_1aa8,auVar17,auVar84);
                          *(undefined1 (*) [16])(ray + 0x80) = auVar156;
                          args.valid = (int *)local_1ac8;
                          args.geometryUserPtr = pGVar7->userPtr;
                          args.context = context->user;
                          args.hit = (RTCHitN *)&local_1978;
                          args.N = 4;
                          pRVar36 = (RTCRayN *)pGVar7->occlusionFilterN;
                          local_1ac8 = auVar84;
                          args.ray = (RTCRayN *)ray;
                          local_1928 = uVar225;
                          uStack_1924 = uVar225;
                          uStack_1920 = uVar225;
                          uStack_191c = uVar225;
                          local_1918 = uVar30;
                          uStack_1914 = uVar30;
                          uStack_1910 = uVar30;
                          uStack_190c = uVar30;
                          uStack_1904 = local_1908;
                          uStack_1900 = local_1908;
                          uStack_18fc = local_1908;
                          uStack_18f4 = local_18f8;
                          uStack_18f0 = local_18f8;
                          uStack_18ec = local_18f8;
                          if (pRVar36 != (RTCRayN *)0x0) {
                            pRVar36 = (RTCRayN *)(*(code *)pRVar36)(&args);
                          }
                          if (local_1ac8 == (undefined1  [16])0x0) {
                            auVar105._8_4_ = 0xffffffff;
                            auVar105._0_8_ = 0xffffffffffffffff;
                            auVar105._12_4_ = 0xffffffff;
                            auVar105 = auVar105 ^ _DAT_01f7ae20;
                          }
                          else {
                            pRVar40 = context->args;
                            if ((pRVar40->filter != (RTCFilterFunctionN)0x0) &&
                               (((pRVar40->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                 RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                              (*pRVar40->filter)(&args);
                            }
                            auVar89._0_4_ = -(uint)(local_1ac8._0_4_ == 0);
                            auVar89._4_4_ = -(uint)(local_1ac8._4_4_ == 0);
                            auVar89._8_4_ = -(uint)(local_1ac8._8_4_ == 0);
                            auVar89._12_4_ = -(uint)(local_1ac8._12_4_ == 0);
                            auVar105 = auVar89 ^ _DAT_01f7ae20;
                            auVar156 = blendvps(_DAT_01f7aa00,
                                                *(undefined1 (*) [16])(args.ray + 0x80),auVar89);
                            *(undefined1 (*) [16])(args.ray + 0x80) = auVar156;
                            pRVar36 = args.ray;
                          }
                          uVar30 = (uint)pRVar36;
                          auVar109._0_4_ = auVar105._0_4_ << 0x1f;
                          auVar109._4_4_ = auVar105._4_4_ << 0x1f;
                          auVar109._8_4_ = auVar105._8_4_ << 0x1f;
                          auVar109._12_4_ = auVar105._12_4_ << 0x1f;
                          auVar84._0_4_ = auVar109._0_4_ >> 0x1f;
                          auVar84._4_4_ = auVar109._4_4_ >> 0x1f;
                          auVar84._8_4_ = auVar109._8_4_ >> 0x1f;
                          auVar84._12_4_ = auVar109._12_4_ >> 0x1f;
                          auVar156 = blendvps(_local_1aa8,*(undefined1 (*) [16])(ray + 0x80),
                                              auVar109);
                          *(undefined1 (*) [16])(ray + 0x80) = auVar156;
                        }
                        local_1b98 = ~auVar84 & local_1b98;
                      }
                      uVar38 = SUB84(pRVar40,0);
                      iVar41 = movmskps(uVar30,local_1b98);
                      if (iVar41 == 0) {
                        iVar41 = 0x7f800000;
                        iVar206 = 0x7f800000;
                        iVar209 = 0x7f800000;
                        iVar212 = 0x7f800000;
                        break;
                      }
                      fVar219 = *(float *)ray;
                      fVar221 = *(float *)(ray + 4);
                      fVar224 = *(float *)(ray + 8);
                      fVar141 = *(float *)(ray + 0xc);
                      fVar145 = *(float *)(ray + 0x10);
                      fVar147 = *(float *)(ray + 0x14);
                      fVar57 = *(float *)(ray + 0x18);
                      fVar76 = *(float *)(ray + 0x1c);
                      fVar77 = *(float *)(ray + 0x20);
                      fVar78 = *(float *)(ray + 0x24);
                      fVar79 = *(float *)(ray + 0x28);
                      fVar91 = *(float *)(ray + 0x2c);
                      fVar92 = *(float *)(ray + 0x40);
                      fVar93 = *(float *)(ray + 0x44);
                      fVar162 = *(float *)(ray + 0x48);
                      fVar173 = *(float *)(ray + 0x4c);
                      fVar111 = auVar153._0_4_ - fVar219;
                      fVar112 = auVar153._4_4_ - fVar221;
                      fVar113 = auVar153._8_4_ - fVar224;
                      fVar114 = auVar153._12_4_ - fVar141;
                      fVar185 = auVar191._0_4_ - fVar145;
                      fVar186 = auVar191._4_4_ - fVar147;
                      fVar188 = auVar191._8_4_ - fVar57;
                      fVar193 = auVar191._12_4_ - fVar76;
                      fVar144 = auVar183._0_4_ - fVar77;
                      fVar163 = auVar183._4_4_ - fVar78;
                      fVar171 = auVar183._8_4_ - fVar79;
                      fVar180 = auVar183._12_4_ - fVar91;
                      fVar207 = fVar217 - fVar219;
                      fVar210 = fVar217 - fVar221;
                      fVar213 = fVar217 - fVar224;
                      fVar217 = fVar217 - fVar141;
                      fVar133 = fVar148 - fVar145;
                      fVar142 = fVar148 - fVar147;
                      fVar94 = fVar148 - fVar57;
                      fVar148 = fVar148 - fVar76;
                      fVar134 = fVar149 - fVar77;
                      fVar143 = fVar149 - fVar78;
                      fVar95 = fVar149 - fVar79;
                      fVar149 = fVar149 - fVar91;
                      fVar219 = fVar234 - fVar219;
                      fVar221 = fVar234 - fVar221;
                      fVar224 = fVar234 - fVar224;
                      fVar234 = fVar234 - fVar141;
                      fVar145 = fVar226 - fVar145;
                      fVar147 = fVar226 - fVar147;
                      fVar57 = fVar226 - fVar57;
                      fVar226 = fVar226 - fVar76;
                      fVar77 = fVar132 - fVar77;
                      fVar78 = fVar132 - fVar78;
                      fVar79 = fVar132 - fVar79;
                      fVar132 = fVar132 - fVar91;
                      fVar115 = fVar219 - fVar111;
                      fVar117 = fVar221 - fVar112;
                      fVar125 = fVar224 - fVar113;
                      fVar127 = fVar234 - fVar114;
                      fVar194 = fVar145 - fVar185;
                      fVar197 = fVar147 - fVar186;
                      fVar200 = fVar57 - fVar188;
                      fVar203 = fVar226 - fVar193;
                      local_1aa8._0_4_ = fVar77 - fVar144;
                      local_1aa8._4_4_ = fVar78 - fVar163;
                      fStack_1aa0 = fVar79 - fVar171;
                      fStack_1a9c = fVar132 - fVar180;
                      auVar19 = *(undefined1 (*) [12])(ray + 0x60);
                      fVar141 = *(float *)(ray + 0x6c);
                      fVar116 = fVar111 - fVar207;
                      fVar118 = fVar112 - fVar210;
                      fVar126 = fVar113 - fVar213;
                      fVar128 = fVar114 - fVar217;
                      local_1b48 = (float)*(undefined8 *)(ray + 0x50);
                      fStack_1b44 = (float)((ulong)*(undefined8 *)(ray + 0x50) >> 0x20);
                      fStack_1b40 = (float)*(undefined8 *)(ray + 0x58);
                      fStack_1b3c = (float)((ulong)*(undefined8 *)(ray + 0x58) >> 0x20);
                      fVar146 = fVar185 - fVar133;
                      fVar170 = fVar186 - fVar142;
                      fVar172 = fVar188 - fVar94;
                      fVar184 = fVar193 - fVar148;
                      fVar216 = (fVar194 * (fVar77 + fVar144) -
                                (fVar145 + fVar185) * (float)local_1aa8._0_4_) * fVar92 +
                                ((fVar219 + fVar111) * (float)local_1aa8._0_4_ -
                                (fVar77 + fVar144) * fVar115) * local_1b48 +
                                (fVar115 * (fVar145 + fVar185) - (fVar219 + fVar111) * fVar194) *
                                *(float *)(ray + 0x60);
                      fVar218 = (fVar197 * (fVar78 + fVar163) -
                                (fVar147 + fVar186) * (float)local_1aa8._4_4_) * fVar93 +
                                ((fVar221 + fVar112) * (float)local_1aa8._4_4_ -
                                (fVar78 + fVar163) * fVar117) * fStack_1b44 +
                                (fVar117 * (fVar147 + fVar186) - (fVar221 + fVar112) * fVar197) *
                                *(float *)(ray + 100);
                      uStack_1b80._0_4_ =
                           (fVar200 * (fVar79 + fVar171) - (fVar57 + fVar188) * fStack_1aa0) *
                           fVar162 + ((fVar224 + fVar113) * fStack_1aa0 -
                                     (fVar79 + fVar171) * fVar125) * fStack_1b40 +
                                     (fVar125 * (fVar57 + fVar188) - (fVar224 + fVar113) * fVar200)
                                     * *(float *)(ray + 0x68);
                      uStack_1b80._4_4_ =
                           (fVar203 * (fVar132 + fVar180) - (fVar226 + fVar193) * fStack_1a9c) *
                           fVar173 + ((fVar234 + fVar114) * fStack_1a9c -
                                     (fVar132 + fVar180) * fVar127) * fStack_1b3c +
                                     (fVar127 * (fVar226 + fVar193) - (fVar234 + fVar114) * fVar203)
                                     * fVar141;
                      fVar195 = fVar144 - fVar134;
                      fVar198 = fVar163 - fVar143;
                      fVar201 = fVar171 - fVar95;
                      fVar204 = fVar180 - fVar149;
                      local_1b58 = auVar19._0_4_;
                      fStack_1b54 = auVar19._4_4_;
                      fStack_1b50 = auVar19._8_4_;
                      fVar76 = (fVar146 * (fVar144 + fVar134) - (fVar185 + fVar133) * fVar195) *
                               fVar92 + ((fVar111 + fVar207) * fVar195 -
                                        (fVar144 + fVar134) * fVar116) * local_1b48 +
                                        (fVar116 * (fVar185 + fVar133) -
                                        (fVar111 + fVar207) * fVar146) * local_1b58;
                      fVar91 = (fVar170 * (fVar163 + fVar143) - (fVar186 + fVar142) * fVar198) *
                               fVar93 + ((fVar112 + fVar210) * fVar198 -
                                        (fVar163 + fVar143) * fVar118) * fStack_1b44 +
                                        (fVar118 * (fVar186 + fVar142) -
                                        (fVar112 + fVar210) * fVar170) * fStack_1b54;
                      auVar151._0_8_ = CONCAT44(fVar91,fVar76);
                      auVar151._8_4_ =
                           (fVar172 * (fVar171 + fVar95) - (fVar188 + fVar94) * fVar201) * fVar162 +
                           ((fVar113 + fVar213) * fVar201 - (fVar171 + fVar95) * fVar126) *
                           fStack_1b40 +
                           (fVar126 * (fVar188 + fVar94) - (fVar113 + fVar213) * fVar172) *
                           fStack_1b50;
                      auVar151._12_4_ =
                           (fVar184 * (fVar180 + fVar149) - (fVar193 + fVar148) * fVar204) * fVar173
                           + ((fVar114 + fVar217) * fVar204 - (fVar180 + fVar149) * fVar128) *
                             fStack_1b3c +
                             (fVar128 * (fVar193 + fVar148) - (fVar114 + fVar217) * fVar184) *
                             fVar141;
                      fVar129 = fVar207 - fVar219;
                      fVar130 = fVar210 - fVar221;
                      fVar131 = fVar213 - fVar224;
                      fVar140 = fVar217 - fVar234;
                      fVar196 = fVar133 - fVar145;
                      fVar199 = fVar142 - fVar147;
                      fVar202 = fVar94 - fVar57;
                      fVar205 = fVar148 - fVar226;
                      fVar208 = fVar134 - fVar77;
                      fVar211 = fVar143 - fVar78;
                      fVar214 = fVar95 - fVar79;
                      fVar215 = fVar149 - fVar132;
                      auVar69._0_4_ =
                           (fVar196 * (fVar77 + fVar134) - (fVar145 + fVar133) * fVar208) * fVar92 +
                           ((fVar219 + fVar207) * fVar208 - (fVar77 + fVar134) * fVar129) *
                           local_1b48 +
                           (fVar129 * (fVar145 + fVar133) - (fVar219 + fVar207) * fVar196) *
                           local_1b58;
                      auVar69._4_4_ =
                           (fVar199 * (fVar78 + fVar143) - (fVar147 + fVar142) * fVar211) * fVar93 +
                           ((fVar221 + fVar210) * fVar211 - (fVar78 + fVar143) * fVar130) *
                           fStack_1b44 +
                           (fVar130 * (fVar147 + fVar142) - (fVar221 + fVar210) * fVar199) *
                           fStack_1b54;
                      auVar69._8_4_ =
                           (fVar202 * (fVar79 + fVar95) - (fVar57 + fVar94) * fVar214) * fVar162 +
                           ((fVar224 + fVar213) * fVar214 - (fVar79 + fVar95) * fVar131) *
                           fStack_1b40 +
                           (fVar131 * (fVar57 + fVar94) - (fVar224 + fVar213) * fVar202) *
                           fStack_1b50;
                      auVar69._12_4_ =
                           (fVar205 * (fVar132 + fVar149) - (fVar226 + fVar148) * fVar215) * fVar173
                           + ((fVar234 + fVar217) * fVar215 - (fVar132 + fVar149) * fVar140) *
                             fStack_1b3c +
                             (fVar140 * (fVar226 + fVar148) - (fVar234 + fVar217) * fVar205) *
                             fVar141;
                      fVar234 = fVar216 + fVar76 + auVar69._0_4_;
                      fVar217 = fVar218 + fVar91 + auVar69._4_4_;
                      auVar102._0_8_ = CONCAT44(fVar217,fVar234);
                      auVar102._8_4_ = (float)uStack_1b80 + auVar151._8_4_ + auVar69._8_4_;
                      auVar102._12_4_ = uStack_1b80._4_4_ + auVar151._12_4_ + auVar69._12_4_;
                      auVar85._4_4_ = fVar218;
                      auVar85._0_4_ = fVar216;
                      auVar85._8_4_ = (float)uStack_1b80;
                      auVar85._12_4_ = uStack_1b80._4_4_;
                      auVar156 = minps(auVar85,auVar151);
                      auVar156 = minps(auVar156,auVar69);
                      local_1b88 = CONCAT44(fVar218,fVar216);
                      auVar137._4_4_ = fVar218;
                      auVar137._0_4_ = fVar216;
                      auVar137._8_4_ = (float)uStack_1b80;
                      auVar137._12_4_ = uStack_1b80._4_4_;
                      auVar176 = maxps(auVar137,auVar151);
                      auVar176 = maxps(auVar176,auVar69);
                      fVar234 = ABS(fVar234) * 1.1920929e-07;
                      fVar217 = ABS(fVar217) * 1.1920929e-07;
                      auVar138._0_8_ =
                           CONCAT44(-(uint)(auVar176._4_4_ <= fVar217 || -fVar217 <= auVar156._4_4_)
                                    & local_1b98._4_4_,
                                    -(uint)(auVar176._0_4_ <= fVar234 || -fVar234 <= auVar156._0_4_)
                                    & local_1b98._0_4_);
                      auVar138._8_4_ =
                           -(uint)(auVar176._8_4_ <= ABS(auVar102._8_4_) * 1.1920929e-07 ||
                                  -(ABS(auVar102._8_4_) * 1.1920929e-07) <= auVar156._8_4_) &
                           local_1b98._8_4_;
                      auVar138._12_4_ =
                           -(uint)(auVar176._12_4_ <= ABS(auVar102._12_4_) * 1.1920929e-07 ||
                                  -(ABS(auVar102._12_4_) * 1.1920929e-07) <= auVar156._12_4_) &
                           local_1b98._12_4_;
                      iVar41 = movmskps(iVar41,auVar138);
                      uVar30 = (uint)DAT_01f7b6c0;
                      uVar222 = DAT_01f7b6c0._4_4_;
                      uVar225 = DAT_01f7b6c0._8_4_;
                      uVar227 = DAT_01f7b6c0._12_4_;
                      if (iVar41 == 0) {
                        auVar169._8_4_ = auVar138._8_4_;
                        auVar169._0_8_ = auVar138._0_8_;
                        auVar169._12_4_ = auVar138._12_4_;
                      }
                      else {
                        auVar122._0_4_ = fVar194 * fVar195 - fVar146 * (float)local_1aa8._0_4_;
                        auVar122._4_4_ = fVar197 * fVar198 - fVar170 * (float)local_1aa8._4_4_;
                        auVar122._8_4_ = fVar200 * fVar201 - fVar172 * fStack_1aa0;
                        auVar122._12_4_ = fVar203 * fVar204 - fVar184 * fStack_1a9c;
                        auVar182._0_4_ = fVar146 * fVar208 - fVar196 * fVar195;
                        auVar182._4_4_ = fVar170 * fVar211 - fVar199 * fVar198;
                        auVar182._8_4_ = fVar172 * fVar214 - fVar202 * fVar201;
                        auVar182._12_4_ = fVar184 * fVar215 - fVar205 * fVar204;
                        auVar70._4_4_ =
                             -(uint)((float)((uint)(fVar170 * (float)local_1aa8._4_4_) & uVar222) <
                                    (float)((uint)(fVar199 * fVar198) & uVar222));
                        auVar70._0_4_ =
                             -(uint)((float)((uint)(fVar146 * (float)local_1aa8._0_4_) & uVar30) <
                                    (float)((uint)(fVar196 * fVar195) & uVar30));
                        auVar70._8_4_ =
                             -(uint)((float)((uint)(fVar172 * fStack_1aa0) & uVar225) <
                                    (float)((uint)(fVar202 * fVar201) & uVar225));
                        auVar70._12_4_ =
                             -(uint)((float)((uint)(fVar184 * fStack_1a9c) & uVar227) <
                                    (float)((uint)(fVar205 * fVar204) & uVar227));
                        auVar96 = blendvps(auVar182,auVar122,auVar70);
                        auVar179._0_4_ = fVar129 * fVar195 - fVar116 * fVar208;
                        auVar179._4_4_ = fVar130 * fVar198 - fVar118 * fVar211;
                        auVar179._8_4_ = fVar131 * fVar201 - fVar126 * fVar214;
                        auVar179._12_4_ = fVar140 * fVar204 - fVar128 * fVar215;
                        auVar71._4_4_ =
                             -(uint)((float)((uint)(fVar117 * fVar198) & uVar222) <
                                    (float)((uint)(fVar118 * fVar211) & uVar222));
                        auVar71._0_4_ =
                             -(uint)((float)((uint)(fVar115 * fVar195) & uVar30) <
                                    (float)((uint)(fVar116 * fVar208) & uVar30));
                        auVar71._8_4_ =
                             -(uint)((float)((uint)(fVar125 * fVar201) & uVar225) <
                                    (float)((uint)(fVar126 * fVar214) & uVar225));
                        auVar71._12_4_ =
                             -(uint)((float)((uint)(fVar127 * fVar204) & uVar227) <
                                    (float)((uint)(fVar128 * fVar215) & uVar227));
                        auVar12._4_4_ = (float)local_1aa8._4_4_ * fVar118 - fVar117 * fVar198;
                        auVar12._0_4_ = (float)local_1aa8._0_4_ * fVar116 - fVar115 * fVar195;
                        auVar12._8_4_ = fStack_1aa0 * fVar126 - fVar125 * fVar201;
                        auVar12._12_4_ = fStack_1a9c * fVar128 - fVar127 * fVar204;
                        auVar154 = blendvps(auVar179,auVar12,auVar71);
                        auVar161._0_4_ = fVar116 * fVar196 - fVar129 * fVar146;
                        auVar161._4_4_ = fVar118 * fVar199 - fVar130 * fVar170;
                        auVar161._8_4_ = fVar126 * fVar202 - fVar131 * fVar172;
                        auVar161._12_4_ = fVar128 * fVar205 - fVar140 * fVar184;
                        auVar72._4_4_ =
                             -(uint)((float)((uint)(fVar118 * fVar197) & uVar222) <
                                    (float)((uint)(fVar130 * fVar170) & uVar222));
                        auVar72._0_4_ =
                             -(uint)((float)((uint)(fVar116 * fVar194) & uVar30) <
                                    (float)((uint)(fVar129 * fVar146) & uVar30));
                        auVar72._8_4_ =
                             -(uint)((float)((uint)(fVar126 * fVar200) & uVar225) <
                                    (float)((uint)(fVar131 * fVar172) & uVar225));
                        auVar72._12_4_ =
                             -(uint)((float)((uint)(fVar128 * fVar203) & uVar227) <
                                    (float)((uint)(fVar140 * fVar184) & uVar227));
                        auVar8._4_4_ = fVar117 * fVar170 - fVar118 * fVar197;
                        auVar8._0_4_ = fVar115 * fVar146 - fVar116 * fVar194;
                        auVar8._8_4_ = fVar125 * fVar172 - fVar126 * fVar200;
                        auVar8._12_4_ = fVar127 * fVar184 - fVar128 * fVar203;
                        auVar176 = blendvps(auVar161,auVar8,auVar72);
                        fVar234 = fVar92 * auVar96._0_4_ +
                                  local_1b48 * auVar154._0_4_ + local_1b58 * auVar176._0_4_;
                        fVar217 = fVar93 * auVar96._4_4_ +
                                  fStack_1b44 * auVar154._4_4_ + fStack_1b54 * auVar176._4_4_;
                        fVar148 = fVar162 * auVar96._8_4_ +
                                  fStack_1b40 * auVar154._8_4_ + fStack_1b50 * auVar176._8_4_;
                        fVar226 = fVar173 * auVar96._12_4_ +
                                  fStack_1b3c * auVar154._12_4_ + fVar141 * auVar176._12_4_;
                        auVar167._0_4_ = fVar234 + fVar234;
                        auVar167._4_4_ = fVar217 + fVar217;
                        auVar167._8_4_ = fVar148 + fVar148;
                        auVar167._12_4_ = fVar226 + fVar226;
                        auVar86._0_4_ = fVar144 * auVar176._0_4_;
                        auVar86._4_4_ = fVar163 * auVar176._4_4_;
                        auVar86._8_4_ = fVar171 * auVar176._8_4_;
                        auVar86._12_4_ = fVar180 * auVar176._12_4_;
                        fVar149 = fVar111 * auVar96._0_4_ + fVar185 * auVar154._0_4_ + auVar86._0_4_
                        ;
                        fVar219 = fVar112 * auVar96._4_4_ + fVar186 * auVar154._4_4_ + auVar86._4_4_
                        ;
                        fVar221 = fVar113 * auVar96._8_4_ + fVar188 * auVar154._8_4_ + auVar86._8_4_
                        ;
                        fVar224 = fVar114 * auVar96._12_4_ +
                                  fVar193 * auVar154._12_4_ + auVar86._12_4_;
                        auVar156 = rcpps(auVar86,auVar167);
                        fVar234 = auVar156._0_4_;
                        fVar217 = auVar156._4_4_;
                        fVar148 = auVar156._8_4_;
                        fVar226 = auVar156._12_4_;
                        fVar234 = ((1.0 - auVar167._0_4_ * fVar234) * fVar234 + fVar234) *
                                  (fVar149 + fVar149);
                        fVar217 = ((1.0 - auVar167._4_4_ * fVar217) * fVar217 + fVar217) *
                                  (fVar219 + fVar219);
                        fVar148 = ((1.0 - auVar167._8_4_ * fVar148) * fVar148 + fVar148) *
                                  (fVar221 + fVar221);
                        fVar226 = ((1.0 - auVar167._12_4_ * fVar226) * fVar226 + fVar226) *
                                  (fVar224 + fVar224);
                        auVar168._0_4_ =
                             (int)((uint)(auVar167._0_4_ != 0.0 &&
                                         (fVar234 <= *(float *)(ray + 0x80) &&
                                         *(float *)(ray + 0x30) <= fVar234)) * -0x80000000) >> 0x1f;
                        auVar168._4_4_ =
                             (int)((uint)(auVar167._4_4_ != 0.0 &&
                                         (fVar217 <= *(float *)(ray + 0x84) &&
                                         *(float *)(ray + 0x34) <= fVar217)) * -0x80000000) >> 0x1f;
                        auVar168._8_4_ =
                             (int)((uint)(auVar167._8_4_ != 0.0 &&
                                         (fVar148 <= *(float *)(ray + 0x88) &&
                                         *(float *)(ray + 0x38) <= fVar148)) * -0x80000000) >> 0x1f;
                        auVar168._12_4_ =
                             (int)((uint)(auVar167._12_4_ != 0.0 &&
                                         (fVar226 <= *(float *)(ray + 0x8c) &&
                                         *(float *)(ray + 0x3c) <= fVar226)) * -0x80000000) >> 0x1f;
                        auVar169 = auVar168 & auVar138;
                        iVar41 = movmskps(iVar41,auVar169);
                        if (iVar41 != 0) {
                          local_1798 = local_1b88;
                          uStack_1790 = uStack_1b80;
                          uStack_19f0 = auVar151._8_8_;
                          uStack_17a0 = uStack_19f0;
                          uStack_1a00 = auVar102._8_8_;
                          uStack_17b0 = uStack_1a00;
                          local_17f8 = auVar176;
                          local_17e8 = auVar154;
                          local_17d8 = auVar96;
                          local_17c8 = fVar234;
                          fStack_17c4 = fVar217;
                          fStack_17c0 = fVar148;
                          fStack_17bc = fVar226;
                          local_17b8 = auVar102._0_8_;
                          local_17a8 = auVar151._0_8_;
                        }
                      }
                      uVar31 = *(uint *)(pre.super_Precalculations.grid + 0x18);
                      pRVar6 = (context->scene->geometries).items;
                      pGVar7 = pRVar6[uVar31].ptr;
                      uVar3 = pGVar7->mask;
                      auVar87._0_4_ = -(uint)((uVar3 & *(uint *)(ray + 0x90)) == 0);
                      auVar87._4_4_ = -(uint)((uVar3 & *(uint *)(ray + 0x94)) == 0);
                      auVar87._8_4_ = -(uint)((uVar3 & *(uint *)(ray + 0x98)) == 0);
                      auVar87._12_4_ = -(uint)((uVar3 & *(uint *)(ray + 0x9c)) == 0);
                      auVar88 = ~auVar87 & auVar169;
                      iVar41 = movmskps((int)pRVar6,auVar88);
                      pRVar40 = (RTCIntersectArguments *)pre.super_Precalculations.grid;
                      if (iVar41 != 0) {
                        uVar4 = *(uint *)(pre.super_Precalculations.grid + 0x1c);
                        pRVar40 = (RTCIntersectArguments *)(ulong)uVar4;
                        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                           (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                          auVar16._8_8_ = uStack_17b0;
                          auVar16._0_8_ = local_17b8;
                          fVar149 = (float)((ulong)local_17b8 >> 0x20);
                          fVar219 = (float)((ulong)uStack_17b0 >> 0x20);
                          auVar156 = rcpps(ZEXT416(uVar3),auVar16);
                          fVar234 = auVar156._0_4_;
                          fVar217 = auVar156._4_4_;
                          fVar148 = auVar156._8_4_;
                          fVar226 = auVar156._12_4_;
                          fVar234 = (float)(-(uint)(1e-18 <= (float)((uint)(float)local_17b8 &
                                                                    uVar30)) &
                                           (uint)(((float)DAT_01f7ba10 - (float)local_17b8 * fVar234
                                                  ) * fVar234 + fVar234));
                          fVar217 = (float)(-(uint)(1e-18 <= (float)((uint)fVar149 & uVar222)) &
                                           (uint)((DAT_01f7ba10._4_4_ - fVar149 * fVar217) * fVar217
                                                 + fVar217));
                          fVar148 = (float)(-(uint)(1e-18 <= (float)((uint)(float)uStack_17b0 &
                                                                    uVar225)) &
                                           (uint)((DAT_01f7ba10._8_4_ - (float)uStack_17b0 * fVar148
                                                  ) * fVar148 + fVar148));
                          fVar226 = (float)(-(uint)(1e-18 <= (float)((uint)fVar219 & uVar227)) &
                                           (uint)((DAT_01f7ba10._12_4_ - fVar219 * fVar226) *
                                                  fVar226 + fVar226));
                          auVar74._0_4_ = (float)local_1798 * fVar234;
                          auVar74._4_4_ = local_1798._4_4_ * fVar217;
                          auVar74._8_4_ = (float)uStack_1790 * fVar148;
                          auVar74._12_4_ = uStack_1790._4_4_ * fVar226;
                          auVar156 = minps(auVar74,_DAT_01f7ba10);
                          auVar106._0_4_ = fVar234 * (float)local_17a8;
                          auVar106._4_4_ = fVar217 * local_17a8._4_4_;
                          auVar106._8_4_ = fVar148 * (float)uStack_17a0;
                          auVar106._12_4_ = fVar226 * uStack_17a0._4_4_;
                          auVar176 = minps(auVar106,_DAT_01f7ba10);
                          uVar30 = *(uint *)(pGVar27 + lVar55 + lVar21);
                          uVar222 = *(uint *)(pGVar27 + lVar55 + lVar21 + 4);
                          auVar139._4_4_ = uVar30;
                          auVar139._0_4_ = uVar30;
                          auVar139._8_4_ = uVar30;
                          auVar139._12_4_ = uVar30;
                          auVar154 = pblendw(auVar139,(undefined1  [16])0x0,0xaa);
                          fVar57 = (float)DAT_01fab990;
                          fVar76 = DAT_01fab990._4_4_;
                          fVar77 = DAT_01fab990._8_4_;
                          fVar78 = DAT_01fab990._12_4_;
                          auVar124._4_4_ = uVar222;
                          auVar124._0_4_ = uVar222;
                          auVar124._8_4_ = uVar222;
                          auVar124._12_4_ = uVar222;
                          fVar234 = auVar156._0_4_;
                          fVar217 = auVar156._4_4_;
                          fVar148 = auVar156._8_4_;
                          fVar226 = auVar156._12_4_;
                          fVar149 = auVar176._0_4_;
                          fVar132 = ((float)DAT_01f7ba10 - fVar234) - fVar149;
                          fVar219 = auVar176._4_4_;
                          fVar141 = (DAT_01f7ba10._4_4_ - fVar217) - fVar219;
                          fVar221 = auVar176._8_4_;
                          fVar145 = (DAT_01f7ba10._8_4_ - fVar148) - fVar221;
                          fVar224 = auVar176._12_4_;
                          fVar147 = (DAT_01f7ba10._12_4_ - fVar226) - fVar224;
                          auVar176 = pblendw(auVar124,(undefined1  [16])0x0,0xaa);
                          uVar225 = *(uint *)(pGVar27 + lVar55 + lVar24);
                          auVar107._4_4_ = uVar225;
                          auVar107._0_4_ = uVar225;
                          auVar107._8_4_ = uVar225;
                          auVar107._12_4_ = uVar225;
                          auVar156 = pblendw(auVar107,(undefined1  [16])0x0,0xaa);
                          local_1948 = (float)auVar156._0_4_ * fVar57 * fVar234 +
                                       (float)auVar176._0_4_ * fVar57 * fVar149 +
                                       (float)auVar154._0_4_ * fVar57 * fVar132;
                          fStack_1944 = (float)auVar156._4_4_ * fVar76 * fVar217 +
                                        (float)auVar176._4_4_ * fVar76 * fVar219 +
                                        (float)auVar154._4_4_ * fVar76 * fVar141;
                          fStack_1940 = (float)auVar156._8_4_ * fVar77 * fVar148 +
                                        (float)auVar176._8_4_ * fVar77 * fVar221 +
                                        (float)auVar154._8_4_ * fVar77 * fVar145;
                          fStack_193c = (float)auVar156._12_4_ * fVar78 * fVar226 +
                                        (float)auVar176._12_4_ * fVar78 * fVar224 +
                                        (float)auVar154._12_4_ * fVar78 * fVar147;
                          local_1938._0_4_ =
                               (float)(uVar225 >> 0x10) * fVar57 * fVar234 +
                               (float)(uVar222 >> 0x10) * fVar57 * fVar149 +
                               fVar132 * (float)(uVar30 >> 0x10) * fVar57;
                          local_1938._4_4_ =
                               (float)(uVar225 >> 0x10) * fVar76 * fVar217 +
                               (float)(uVar222 >> 0x10) * fVar76 * fVar219 +
                               fVar141 * (float)(uVar30 >> 0x10) * fVar76;
                          fStack_1930 = (float)(uVar225 >> 0x10) * fVar77 * fVar148 +
                                        (float)(uVar222 >> 0x10) * fVar77 * fVar221 +
                                        fVar145 * (float)(uVar30 >> 0x10) * fVar77;
                          fStack_192c = (float)(uVar225 >> 0x10) * fVar78 * fVar226 +
                                        (float)(uVar222 >> 0x10) * fVar78 * fVar224 +
                                        fVar147 * (float)(uVar30 >> 0x10) * fVar78;
                          local_1978 = local_17d8._0_8_;
                          uStack_1970 = local_17d8._8_8_;
                          local_1968 = local_17e8._0_8_;
                          uStack_1960 = local_17e8._8_8_;
                          local_1958 = local_17f8;
                          local_1908 = context->user->instID[0];
                          local_18f8 = context->user->instPrimID[0];
                          auVar156 = *(undefined1 (*) [16])(ray + 0x80);
                          auVar15._4_4_ = fStack_17c4;
                          auVar15._0_4_ = local_17c8;
                          auVar15._8_4_ = fStack_17c0;
                          auVar15._12_4_ = fStack_17bc;
                          auVar176 = blendvps(auVar156,auVar15,auVar88);
                          *(undefined1 (*) [16])(ray + 0x80) = auVar176;
                          args.valid = (int *)local_1ac8;
                          args.geometryUserPtr = pGVar7->userPtr;
                          args.context = context->user;
                          args.hit = (RTCHitN *)&local_1978;
                          args.N = 4;
                          pRVar36 = (RTCRayN *)pGVar7->occlusionFilterN;
                          local_1ac8 = auVar88;
                          args.ray = (RTCRayN *)ray;
                          local_1928 = uVar4;
                          uStack_1924 = uVar4;
                          uStack_1920 = uVar4;
                          uStack_191c = uVar4;
                          local_1918 = uVar31;
                          uStack_1914 = uVar31;
                          uStack_1910 = uVar31;
                          uStack_190c = uVar31;
                          uStack_1904 = local_1908;
                          uStack_1900 = local_1908;
                          uStack_18fc = local_1908;
                          uStack_18f4 = local_18f8;
                          uStack_18f0 = local_18f8;
                          uStack_18ec = local_18f8;
                          if (pRVar36 != (RTCRayN *)0x0) {
                            pRVar36 = (RTCRayN *)(*(code *)pRVar36)(&args);
                          }
                          if (local_1ac8 == (undefined1  [16])0x0) {
                            auVar108._8_4_ = 0xffffffff;
                            auVar108._0_8_ = 0xffffffffffffffff;
                            auVar108._12_4_ = 0xffffffff;
                            auVar108 = auVar108 ^ _DAT_01f7ae20;
                          }
                          else {
                            pRVar40 = context->args;
                            if ((pRVar40->filter != (RTCFilterFunctionN)0x0) &&
                               (((pRVar40->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                 RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                              (*pRVar40->filter)(&args);
                            }
                            auVar90._0_4_ = -(uint)(local_1ac8._0_4_ == 0);
                            auVar90._4_4_ = -(uint)(local_1ac8._4_4_ == 0);
                            auVar90._8_4_ = -(uint)(local_1ac8._8_4_ == 0);
                            auVar90._12_4_ = -(uint)(local_1ac8._12_4_ == 0);
                            auVar108 = auVar90 ^ _DAT_01f7ae20;
                            auVar176 = blendvps(_DAT_01f7aa00,
                                                *(undefined1 (*) [16])(args.ray + 0x80),auVar90);
                            *(undefined1 (*) [16])(args.ray + 0x80) = auVar176;
                            pRVar36 = args.ray;
                          }
                          uVar31 = (uint)pRVar36;
                          auVar110._0_4_ = auVar108._0_4_ << 0x1f;
                          auVar110._4_4_ = auVar108._4_4_ << 0x1f;
                          auVar110._8_4_ = auVar108._8_4_ << 0x1f;
                          auVar110._12_4_ = auVar108._12_4_ << 0x1f;
                          auVar88._0_4_ = auVar110._0_4_ >> 0x1f;
                          auVar88._4_4_ = auVar110._4_4_ >> 0x1f;
                          auVar88._8_4_ = auVar110._8_4_ >> 0x1f;
                          auVar88._12_4_ = auVar110._12_4_ >> 0x1f;
                          auVar156 = blendvps(auVar156,*(undefined1 (*) [16])(ray + 0x80),auVar110);
                          *(undefined1 (*) [16])(ray + 0x80) = auVar156;
                        }
                        local_1b98 = ~auVar88 & local_1b98;
                      }
                      iVar212 = 0x7f800000;
                      iVar209 = 0x7f800000;
                      iVar206 = 0x7f800000;
                      iVar41 = 0x7f800000;
                      uVar38 = SUB84(pRVar40,0);
                      iVar32 = movmskps(uVar31,local_1b98);
                      lVar55 = lVar55 + 4;
                    } while (iVar32 != 0);
                    lVar49 = 1;
                    uVar37 = 0;
                  } while (((byte)local_1aac & iVar2 != 2) != 0);
                  local_1b98._0_8_ = local_1b98._0_8_ ^ 0xffffffffffffffff;
                  local_1b98._8_4_ = local_1b98._8_4_ ^ 0xffffffff;
                  local_1b98._12_4_ = local_1b98._12_4_ ^ 0xffffffff;
                  puVar33 = (undefined1 *)0x0;
                  valid_i = (vint<4> *)pGVar27;
                }
                else {
                  pre.super_Precalculations.grid = (GridSOA *)(root.ptr & 0xfffffffffffffff0);
                  puVar33 = *(undefined1 **)
                             (pre.super_Precalculations.grid +
                             (ulong)*(uint *)(pre.super_Precalculations.grid + 0x2c) + 0x30);
                  local_1b98._8_8_ = uVar26;
                  local_1b98._0_8_ = uVar25;
                }
                terminated.field_0 =
                     (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                     (local_1b98 | (undefined1  [16])terminated.field_0);
                uVar29 = movmskps(uVar38,(undefined1  [16])terminated.field_0);
                sVar39 = (size_t)uVar29;
                if (uVar29 == 0xf) goto LAB_00dbf07d;
                tray.tfar.field_0 =
                     (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01f7aa00,
                              (undefined1  [16])terminated.field_0);
                if (puVar33 != (undefined1 *)0x0) {
                  pNVar53->ptr = (size_t)puVar33;
                  pNVar53 = pNVar53 + 1;
                  *(undefined8 *)paVar56 = 0xff800000ff800000;
                  *(float *)((long)paVar56 + 8) = -INFINITY;
                  *(float *)((long)paVar56 + 0xc) = -INFINITY;
                  paVar56 = paVar56 + 1;
                }
              }
              goto LAB_00dbd981;
            }
            sVar39 = root.ptr & 0xfffffffffffffff0;
            lVar43 = 0;
            aVar81.i[1] = iVar206;
            aVar81.i[0] = iVar41;
            aVar81.i[2] = iVar209;
            aVar81.i[3] = iVar212;
            sVar50 = 8;
            do {
              sVar5 = *(size_t *)(sVar39 + lVar43 * 8);
              sVar47 = sVar50;
              if (sVar5 == 8) break;
              fVar234 = *(float *)(root.ptr + 0x20 + lVar43 * 4);
              fVar217 = *(float *)(root.ptr + 0x30 + lVar43 * 4);
              fVar148 = *(float *)(root.ptr + 0x40 + lVar43 * 4);
              fVar226 = *(float *)(root.ptr + 0x50 + lVar43 * 4);
              auVar97._0_8_ =
                   CONCAT44((fVar234 - (float)tray.org.field_0._4_4_) * tray.rdir.field_0._4_4_,
                            (fVar234 - (float)tray.org.field_0._0_4_) * tray.rdir.field_0._0_4_);
              auVar97._8_4_ = (fVar234 - (float)tray.org.field_0._8_4_) * tray.rdir.field_0._8_4_;
              auVar97._12_4_ = (fVar234 - (float)tray.org.field_0._12_4_) * tray.rdir.field_0._12_4_
              ;
              auVar60._0_8_ =
                   CONCAT44((fVar148 - (float)tray.org.field_0._20_4_) * tray.rdir.field_0._20_4_,
                            (fVar148 - (float)tray.org.field_0._16_4_) * tray.rdir.field_0._16_4_);
              auVar60._8_4_ = (fVar148 - (float)tray.org.field_0._24_4_) * tray.rdir.field_0._24_4_;
              auVar60._12_4_ = (fVar148 - (float)tray.org.field_0._28_4_) * tray.rdir.field_0._28_4_
              ;
              fVar234 = *(float *)(root.ptr + 0x60 + lVar43 * 4);
              auVar150._0_8_ =
                   CONCAT44((fVar234 - (float)tray.org.field_0._36_4_) *
                            (float)tray.rdir.field_0._36_4_,
                            (fVar234 - (float)tray.org.field_0._32_4_) *
                            (float)tray.rdir.field_0._32_4_);
              auVar150._8_4_ =
                   (fVar234 - (float)tray.org.field_0._40_4_) * (float)tray.rdir.field_0._40_4_;
              auVar150._12_4_ =
                   (fVar234 - (float)tray.org.field_0._44_4_) * (float)tray.rdir.field_0._44_4_;
              auVar120._0_4_ = (fVar217 - (float)tray.org.field_0._0_4_) * tray.rdir.field_0._0_4_;
              auVar120._4_4_ = (fVar217 - (float)tray.org.field_0._4_4_) * tray.rdir.field_0._4_4_;
              auVar120._8_4_ = (fVar217 - (float)tray.org.field_0._8_4_) * tray.rdir.field_0._8_4_;
              auVar120._12_4_ =
                   (fVar217 - (float)tray.org.field_0._12_4_) * tray.rdir.field_0._12_4_;
              auVar135._0_4_ = (fVar226 - (float)tray.org.field_0._16_4_) * tray.rdir.field_0._16_4_
              ;
              auVar135._4_4_ = (fVar226 - (float)tray.org.field_0._20_4_) * tray.rdir.field_0._20_4_
              ;
              auVar135._8_4_ = (fVar226 - (float)tray.org.field_0._24_4_) * tray.rdir.field_0._24_4_
              ;
              auVar135._12_4_ =
                   (fVar226 - (float)tray.org.field_0._28_4_) * tray.rdir.field_0._28_4_;
              fVar234 = *(float *)(root.ptr + 0x70 + lVar43 * 4);
              auVar164._0_4_ =
                   (fVar234 - (float)tray.org.field_0._32_4_) * (float)tray.rdir.field_0._32_4_;
              auVar164._4_4_ =
                   (fVar234 - (float)tray.org.field_0._36_4_) * (float)tray.rdir.field_0._36_4_;
              auVar164._8_4_ =
                   (fVar234 - (float)tray.org.field_0._40_4_) * (float)tray.rdir.field_0._40_4_;
              auVar164._12_4_ =
                   (fVar234 - (float)tray.org.field_0._44_4_) * (float)tray.rdir.field_0._44_4_;
              auVar155._8_4_ = auVar97._8_4_;
              auVar155._0_8_ = auVar97._0_8_;
              auVar155._12_4_ = auVar97._12_4_;
              auVar156 = minps(auVar155,auVar120);
              auVar175._8_4_ = auVar60._8_4_;
              auVar175._0_8_ = auVar60._0_8_;
              auVar175._12_4_ = auVar60._12_4_;
              auVar176 = minps(auVar175,auVar135);
              auVar156 = maxps(auVar156,auVar176);
              auVar177._8_4_ = auVar150._8_4_;
              auVar177._0_8_ = auVar150._0_8_;
              auVar177._12_4_ = auVar150._12_4_;
              auVar176 = minps(auVar177,auVar164);
              auVar156 = maxps(auVar156,auVar176);
              auVar157._0_8_ = CONCAT44(auVar156._4_4_ * 0.99999964,auVar156._0_4_ * 0.99999964);
              auVar157._8_4_ = auVar156._8_4_ * 0.99999964;
              auVar157._12_4_ = auVar156._12_4_ * 0.99999964;
              auVar176 = maxps(auVar97,auVar120);
              auVar156 = maxps(auVar60,auVar135);
              auVar156 = minps(auVar176,auVar156);
              auVar176 = maxps(auVar150,auVar164);
              auVar156 = minps(auVar156,auVar176);
              auVar98._0_4_ = auVar156._0_4_ * 1.0000004;
              auVar98._4_4_ = auVar156._4_4_ * 1.0000004;
              auVar98._8_4_ = auVar156._8_4_ * 1.0000004;
              auVar98._12_4_ = auVar156._12_4_ * 1.0000004;
              auVar61._8_4_ = auVar157._8_4_;
              auVar61._0_8_ = auVar157._0_8_;
              auVar61._12_4_ = auVar157._12_4_;
              auVar156 = maxps(auVar61,(undefined1  [16])tray.tnear.field_0);
              auVar176 = minps(auVar98,(undefined1  [16])tray.tfar.field_0);
              auVar62._4_4_ = -(uint)(auVar156._4_4_ <= auVar176._4_4_);
              auVar62._0_4_ = -(uint)(auVar156._0_4_ <= auVar176._0_4_);
              auVar62._8_4_ = -(uint)(auVar156._8_4_ <= auVar176._8_4_);
              auVar62._12_4_ = -(uint)(auVar156._12_4_ <= auVar176._12_4_);
              uVar29 = movmskps((int)valid_i,auVar62);
              valid_i = (vint<4> *)(ulong)uVar29;
              aVar100 = aVar81;
              if ((uVar29 != 0) &&
                 (auVar99._4_4_ = iVar206, auVar99._0_4_ = iVar41, auVar99._8_4_ = iVar209,
                 auVar99._12_4_ = iVar212,
                 aVar100 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                           blendvps(auVar99,auVar157,auVar62), sVar47 = sVar5, sVar50 != 8)) {
                pNVar53->ptr = sVar50;
                pNVar53 = pNVar53 + 1;
                *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar56->v = aVar81;
                paVar56 = paVar56 + 1;
              }
              aVar81 = aVar100;
              lVar43 = lVar43 + 1;
              sVar50 = sVar47;
            } while (lVar43 != 4);
            puVar33 = (undefined1 *)0x4;
            if (sVar47 == 8) goto LAB_00dbdb5d;
            auVar63._4_4_ = -(uint)(aVar81.v[1] < tray.tfar.field_0.v[1]);
            auVar63._0_4_ = -(uint)(aVar81.v[0] < tray.tfar.field_0.v[0]);
            auVar63._8_4_ = -(uint)(aVar81.v[2] < tray.tfar.field_0.v[2]);
            auVar63._12_4_ = -(uint)(aVar81.v[3] < tray.tfar.field_0.v[3]);
            uVar38 = movmskps((int)sVar39,auVar63);
            sVar39 = (size_t)(uint)POPCOUNT(uVar38);
            root.ptr = sVar47;
          } while ((byte)puVar51 < (byte)POPCOUNT(uVar38));
          pNVar53->ptr = sVar47;
          pNVar53 = pNVar53 + 1;
          *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar56->v = aVar81;
          paVar56 = paVar56 + 1;
        }
        else {
          do {
            sVar50 = 0;
            if (uVar54 != 0) {
              for (; (uVar54 >> sVar50 & 1) == 0; sVar50 = sVar50 + 1) {
              }
            }
            sVar39 = sVar50;
            valid_i = (vint<4> *)This;
            bVar28 = occluded1(This,bvh,root,sVar50,&pre,ray,&tray,context);
            if (bVar28) {
              terminated.field_0.i[sVar50] = -1;
            }
            uVar44 = uVar54 - 1;
            uVar54 = uVar54 & uVar44;
          } while (uVar54 != 0);
          iVar41 = movmskps((int)uVar44,(undefined1  [16])terminated.field_0);
          if (iVar41 == 0xf) {
            puVar33 = (undefined1 *)0x3;
          }
          else {
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01f7aa00,
                          (undefined1  [16])terminated.field_0);
            puVar33 = (undefined1 *)0x2;
          }
          iVar41 = 0x7f800000;
          iVar206 = 0x7f800000;
          iVar209 = 0x7f800000;
          iVar212 = 0x7f800000;
          if (puVar51 < puVar34) goto LAB_00dbd9c0;
        }
LAB_00dbdb5d:
      } while (((int)puVar33 == 4) || ((int)puVar33 == 2));
LAB_00dbf07d:
      auVar75._4_4_ = uVar192 & terminated.field_0.i[1];
      auVar75._0_4_ = uVar187 & terminated.field_0.i[0];
      auVar75._8_4_ = auVar189._8_4_ & terminated.field_0.i[2];
      auVar75._12_4_ = auVar189._12_4_ & terminated.field_0.i[3];
      auVar156 = blendvps(*(undefined1 (*) [16])(ray + 0x80),_DAT_01f7aa00,auVar75);
      *(undefined1 (*) [16])(ray + 0x80) = auVar156;
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }